

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void google::protobuf::TextFormat::OutOfLinePrintString<absl::lts_20250127::Hex>
               (BaseTextGenerator *generator,Hex *values)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined6 uVar3;
  undefined8 in_RCX;
  Hex hex;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  undefined8 local_30;
  long local_28 [2];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_50 = 0;
  uVar1 = values->width;
  uVar2 = values->fill;
  uVar3 = *(undefined6 *)&values->field_0xa;
  hex.value._2_6_ = uVar3;
  hex.value._1_1_ = uVar2;
  hex.value._0_1_ = uVar1;
  hex._8_8_ = in_RCX;
  local_58 = local_48;
  absl::lts_20250127::AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
            ((lts_20250127 *)&local_58,(StringifySink *)values->value,hex);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,local_58,local_50 + (long)local_58);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}